

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O2

string * __thiscall Address::getCity_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->city);
  return __return_storage_ptr__;
}

Assistant:

string Address::getCity() {
    return city;
}